

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  long lVar4;
  double r;
  double p;
  delim_c local_5a;
  delim_c local_59;
  double local_58;
  double local_50;
  param_type local_48;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_48.p_._0_1_ = 0x28;
  pbVar2 = utility::operator>>(in,(delim_c *)&local_48);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_59.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_59);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_5a.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_5a);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    negative_binomial_dist::param_type::param_type(&local_48,local_50,local_58);
    negative_binomial_dist::param_type::operator=(P,&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_48.P_.super__Vector_base<double,_std::allocator<double>_>);
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   negative_binomial_dist::param_type &P) {
    double p;
    double r;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> p >> utility::delim(' ') >> r >> utility::delim(')');
    if (in)
      P = negative_binomial_dist::param_type(p, r);
    in.flags(flags);
    return in;
  }